

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelSensorsTransformers.cpp
# Opt level: O0

bool iDynTree::createReducedModelAndSensors
               (Model *fullModel,SensorsList *fullSensors,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *jointsInReducedModel,Model *reducedModel,SensorsList *reducedSensors)

{
  bool bVar1;
  SensorsList *other;
  Model *in_RCX;
  Model fullModelCopy;
  SensorsList *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar2;
  Model *in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  Model *in_stack_fffffffffffffec0;
  Model *in_stack_fffffffffffffed8;
  Model *in_stack_fffffffffffffee0;
  
  Model::Model(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Model::sensors((Model *)&stack0xfffffffffffffea0);
  SensorsList::operator=
            ((SensorsList *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  bVar1 = createReducedModel(in_stack_fffffffffffffec0,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  uVar2 = bVar1;
  if (bVar1) {
    other = Model::sensors(in_RCX);
    SensorsList::operator=((SensorsList *)CONCAT17(uVar2,in_stack_fffffffffffffe70),other);
  }
  Model::~Model((Model *)CONCAT17(uVar2,in_stack_fffffffffffffe70));
  return bVar1;
}

Assistant:

bool createReducedModelAndSensors(const Model& fullModel,
                                  const SensorsList& fullSensors,
                                  const std::vector<std::string>& jointsInReducedModel,
                                        Model& reducedModel,
                                        SensorsList& reducedSensors)
{
    Model fullModelCopy = fullModel;
    fullModelCopy.sensors() = fullSensors;

    if (!createReducedModel(fullModelCopy, jointsInReducedModel, reducedModel)) {
        return false;
    }

    reducedSensors = reducedModel.sensors();

    return true;
}